

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.h
# Opt level: O0

void __thiscall
icu_63::number::impl::ConstantMultiFieldModifier::ConstantMultiFieldModifier
          (ConstantMultiFieldModifier *this,NumberStringBuilder *prefix,NumberStringBuilder *suffix,
          bool overwrite,bool strong)

{
  bool strong_local;
  bool overwrite_local;
  NumberStringBuilder *suffix_local;
  NumberStringBuilder *prefix_local;
  ConstantMultiFieldModifier *this_local;
  
  Modifier::Modifier(&this->super_Modifier);
  (this->super_Modifier)._vptr_Modifier = (_func_int **)&PTR__ConstantMultiFieldModifier_0049fb58;
  NumberStringBuilder::NumberStringBuilder(&this->fPrefix,prefix);
  NumberStringBuilder::NumberStringBuilder(&this->fSuffix,suffix);
  this->fOverwrite = overwrite;
  this->fStrong = strong;
  Modifier::Parameters::Parameters(&this->fParameters);
  return;
}

Assistant:

ConstantMultiFieldModifier(
            const NumberStringBuilder &prefix,
            const NumberStringBuilder &suffix,
            bool overwrite,
            bool strong)
      : fPrefix(prefix),
        fSuffix(suffix),
        fOverwrite(overwrite),
        fStrong(strong) {}